

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format.c
# Opt level: O0

int archive_write_set_format(archive *a,int code)

{
  int iVar1;
  int local_20;
  int i;
  int code_local;
  archive *a_local;
  
  local_20 = 0;
  while( true ) {
    if (codes[local_20].code == 0) {
      archive_set_error(a,0x16,"No such format");
      return -0x1e;
    }
    if (code == codes[local_20].code) break;
    local_20 = local_20 + 1;
  }
  iVar1 = (*codes[local_20].setter)(a);
  return iVar1;
}

Assistant:

int
archive_write_set_format(struct archive *a, int code)
{
	int i;

	for (i = 0; codes[i].code != 0; i++) {
		if (code == codes[i].code)
			return ((codes[i].setter)(a));
	}

	archive_set_error(a, EINVAL, "No such format");
	return (ARCHIVE_FATAL);
}